

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O3

ValueUnion Assimp::PLY::PropertyInstance::DefaultValue(EDataType eType)

{
  ValueUnion out;
  
  if (eType == EDT_Double) {
    out.fDouble = 0.0;
  }
  else {
    out.fDouble = out.fDouble & 0xffffffff00000000;
  }
  return (ValueUnion)out.fDouble;
}

Assistant:

PLY::PropertyInstance::ValueUnion PLY::PropertyInstance::DefaultValue(PLY::EDataType eType)
{
  PLY::PropertyInstance::ValueUnion out;

  switch (eType)
  {
  case EDT_Float:
    out.fFloat = 0.f;
    return out;

  case EDT_Double:
    out.fDouble = 0.;
    return out;

  default:;
  };
  out.iUInt = 0;
  return out;
}